

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

Aig_Obj_t * Saig_BmcObjChild1(Saig_Bmc_t *p,Aig_Obj_t *pObj,int i)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int i_local;
  Aig_Obj_t *pObj_local;
  Saig_Bmc_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 == 0) {
    pAVar2 = Aig_ObjFanin1(pObj);
    pAVar2 = Saig_BmcObjFrame(p,pAVar2,i);
    iVar1 = Aig_ObjFaninC1(pObj);
    pAVar2 = Aig_NotCond(pAVar2,iVar1);
    return pAVar2;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                ,0x62,"Aig_Obj_t *Saig_BmcObjChild1(Saig_Bmc_t *, Aig_Obj_t *, int)");
}

Assistant:

static inline Aig_Obj_t * Saig_BmcObjChild1( Saig_Bmc_t * p, Aig_Obj_t * pObj, int i )                   { assert( !Aig_IsComplement(pObj) ); return Aig_NotCond(Saig_BmcObjFrame(p, Aig_ObjFanin1(pObj), i), Aig_ObjFaninC1(pObj));  }